

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

int __thiscall
xla::GraphCycles::FindPath(GraphCycles *this,int32_t x,int32_t y,int max_path_len,int32_t *path)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  vector<int,_std::allocator<int>_> *this_00;
  reference piVar4;
  pair<std::__detail::_Node_iterator<int,_true,_false>,_bool> pVar5;
  int local_ac;
  const_iterator cStack_a8;
  int w;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  int local_88;
  int32_t n;
  undefined1 local_78 [8];
  NodeSet seen;
  Rep *r;
  int path_len;
  int32_t *path_local;
  int max_path_len_local;
  int32_t y_local;
  int32_t x_local;
  GraphCycles *this_local;
  
  r._4_4_ = 0;
  seen._M_h._M_single_bucket = (__node_base_ptr)this->rep_;
  max_path_len_local = x;
  _y_local = this;
  std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::unordered_set
            ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             local_78);
  std::vector<int,_std::allocator<int>_>::clear
            ((vector<int,_std::allocator<int>_> *)(seen._M_h._M_single_bucket + 0x15));
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)(seen._M_h._M_single_bucket + 0x15),
             &max_path_len_local);
  while (bVar1 = std::vector<int,_std::allocator<int>_>::empty
                           ((vector<int,_std::allocator<int>_> *)(seen._M_h._M_single_bucket + 0x15)
                           ), ((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::back
                       ((vector<int,_std::allocator<int>_> *)(seen._M_h._M_single_bucket + 0x15));
    local_88 = *pvVar2;
    std::vector<int,_std::allocator<int>_>::pop_back
              ((vector<int,_std::allocator<int>_> *)(seen._M_h._M_single_bucket + 0x15));
    if (local_88 < 0) {
      r._4_4_ = r._4_4_ + -1;
    }
    else {
      if (r._4_4_ < max_path_len) {
        path[r._4_4_] = local_88;
      }
      r._4_4_ = r._4_4_ + 1;
      __range2._4_4_ = 0xffffffff;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)(seen._M_h._M_single_bucket + 0x15),
                 (value_type_conflict1 *)((long)&__range2 + 4));
      this_local._4_4_ = r._4_4_;
      if (local_88 == y) goto LAB_0025b462;
      pvVar3 = std::
               vector<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
               ::operator[]((vector<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
                             *)(seen._M_h._M_single_bucket + 3),(long)local_88);
      this_00 = OrderedSet<int>::GetSequence(&pvVar3->out);
      __end2 = std::vector<int,_std::allocator<int>_>::begin(this_00);
      cStack_a8 = std::vector<int,_std::allocator<int>_>::end(this_00);
      while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff58), bVar1) {
        piVar4 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*(&__end2);
        local_ac = *piVar4;
        pVar5 = std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
                insert((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                        *)local_78,&local_ac);
        if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)(seen._M_h._M_single_bucket + 0x15),
                     &local_ac);
        }
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(&__end2);
      }
    }
  }
  this_local._4_4_ = 0;
LAB_0025b462:
  __range2._0_4_ = 1;
  std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::~unordered_set
            ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             local_78);
  return this_local._4_4_;
}

Assistant:

int GraphCycles::FindPath(int32_t x, int32_t y, int max_path_len,
                          int32_t path[]) const {
  // Forward depth first search starting at x until we hit y.
  // As we descend into a node, we push it onto the path.
  // As we leave a node, we remove it from the path.
  int path_len = 0;

  Rep* r = rep_;
  NodeSet seen;
  r->stack_.clear();
  r->stack_.push_back(x);
  while (!r->stack_.empty()) {
    int32_t n = r->stack_.back();
    r->stack_.pop_back();
    if (n < 0) {
      // Marker to indicate that we are leaving a node
      path_len--;
      continue;
    }

    if (path_len < max_path_len) {
      path[path_len] = n;
    }
    path_len++;
    r->stack_.push_back(-1);  // Will remove tentative path entry

    if (n == y) {
      return path_len;
    }

    for (auto w : r->node_io_[n].out.GetSequence()) {
      if (seen.insert(w).second) {
        r->stack_.push_back(w);
      }
    }
  }

  return 0;
}